

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_iso_multi_extent.c
# Opt level: O0

void test_read_format_iso_multi_extent(void)

{
  int iVar1;
  archive *a_00;
  char *pcVar2;
  char *unaff_retaddr;
  void *in_stack_00000008;
  wchar_t in_stack_00000014;
  char *in_stack_00000018;
  int i;
  int64_t offset;
  size_t size;
  void *p;
  archive *a;
  archive_entry *ae;
  char *refname;
  char *in_stack_000003c0;
  archive *in_stack_ffffffffffffffa8;
  archive *paVar3;
  archive_entry *entry;
  archive_entry_conflict *paVar4;
  int64_t *piVar5;
  archive *in_stack_ffffffffffffffb0;
  size_t *s;
  archive *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  wchar_t in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar6;
  wchar_t in_stack_ffffffffffffffd4;
  char *in_stack_ffffffffffffffd8;
  void *in_stack_ffffffffffffffe0;
  archive_entry *in_stack_fffffffffffffff0;
  char *_v2;
  
  _v2 = "test_read_format_iso_multi_extent.iso.Z";
  extract_reference_file(in_stack_000003c0);
  a_00 = archive_read_new();
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   (wchar_t)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,
                   in_stack_ffffffffffffffa8);
  archive_read_support_filter_all(in_stack_ffffffffffffffa8);
  paVar3 = (archive *)0x0;
  assertion_equal_int((char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                      (char *)in_stack_ffffffffffffffb0,0,(char *)0x17c375,in_stack_ffffffffffffffe0
                     );
  archive_read_support_format_all(paVar3);
  assertion_equal_int((char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                      (char *)in_stack_ffffffffffffffb0,0,(char *)0x17c3ad,in_stack_ffffffffffffffe0
                     );
  archive_read_open_filename
            ((archive *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (char *)in_stack_ffffffffffffffb8,(size_t)in_stack_ffffffffffffffb0);
  paVar3 = (archive *)0x0;
  assertion_equal_int((char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                      (char *)in_stack_ffffffffffffffb0,0,(char *)0x17c3ef,in_stack_ffffffffffffffe0
                     );
  for (iVar6 = 0; iVar6 < 2; iVar6 = iVar6 + 1) {
    archive_read_next_header(in_stack_ffffffffffffffb0,(archive_entry **)paVar3);
    entry = (archive_entry *)0x0;
    assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),in_stack_ffffffffffffffc4,
                        (longlong)in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,0,
                        (char *)0x17c43f,in_stack_ffffffffffffffe0);
    pcVar2 = archive_entry_pathname(entry);
    iVar1 = strcmp(".",pcVar2);
    if (iVar1 == 0) {
      archive_entry_filetype(in_stack_fffffffffffffff0);
      assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                          in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                          (char *)in_stack_ffffffffffffffb0,0,(char *)0x17c49e,
                          in_stack_ffffffffffffffe0);
      archive_entry_size(in_stack_fffffffffffffff0);
      assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                          in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                          (char *)in_stack_ffffffffffffffb0,0,(char *)0x17c4d9,
                          in_stack_ffffffffffffffe0);
      archive_entry_mtime(in_stack_fffffffffffffff0);
      assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                          in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                          (char *)in_stack_ffffffffffffffb0,0,(char *)0x17c514,
                          in_stack_ffffffffffffffe0);
      archive_entry_mtime_nsec(in_stack_fffffffffffffff0);
      paVar4 = (archive_entry_conflict *)0x0;
      assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                          in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                          (char *)in_stack_ffffffffffffffb0,0,(char *)0x17c54c,
                          in_stack_ffffffffffffffe0);
      archive_entry_stat(paVar4);
      assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                          in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                          (char *)in_stack_ffffffffffffffb0,0,(char *)0x17c588,
                          in_stack_ffffffffffffffe0);
      archive_entry_uid(in_stack_fffffffffffffff0);
      piVar5 = (int64_t *)0x0;
      assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                          in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                          (char *)in_stack_ffffffffffffffb0,0,(char *)0x17c5c3,
                          in_stack_ffffffffffffffe0);
      archive_read_data_block
                ((archive *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 (void **)in_stack_ffffffffffffffb8,(size_t *)in_stack_ffffffffffffffb0,piVar5);
      assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                          in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                          (char *)in_stack_ffffffffffffffb0,(longlong)a_00,(char *)0x17c60c,
                          in_stack_ffffffffffffffe0);
      paVar3 = (archive *)0x0;
      assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                          in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                          (char *)in_stack_ffffffffffffffb0,0,(char *)0x17c640,
                          in_stack_ffffffffffffffe0);
    }
    else {
      pcVar2 = archive_entry_pathname(entry);
      iVar1 = strcmp("file",pcVar2);
      if (iVar1 == 0) {
        archive_entry_pathname(entry);
        s = (size_t *)((ulong)in_stack_ffffffffffffffb0 & 0xffffffff00000000);
        assertion_equal_string
                  (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                   (char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                   (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   (char *)in_stack_ffffffffffffffb8,(char *)s,in_stack_fffffffffffffff0,
                   (wchar_t)_v2);
        archive_entry_filetype(in_stack_fffffffffffffff0);
        assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                            in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,(char *)s,
                            0,(char *)0x17c6eb,in_stack_ffffffffffffffe0);
        archive_entry_size(in_stack_fffffffffffffff0);
        piVar5 = (int64_t *)0x0;
        assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                            in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,(char *)s,
                            0,(char *)0x17c726,in_stack_ffffffffffffffe0);
        archive_read_data_block
                  ((archive *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   (void **)in_stack_ffffffffffffffb8,s,piVar5);
        assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                            in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,(char *)s,
                            0,(char *)0x17c76d,in_stack_ffffffffffffffe0);
        assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                            in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,(char *)s,
                            0,(char *)0x17c79d,in_stack_ffffffffffffffe0);
        in_stack_ffffffffffffffb0 = (archive *)0x2e78ab;
        in_stack_ffffffffffffffb8 = (archive *)0x0;
        assertion_equal_mem(in_stack_00000018,in_stack_00000014,in_stack_00000008,unaff_retaddr,_v2,
                            (char *)in_stack_fffffffffffffff0,size,(char *)p,a);
        archive_entry_mtime(in_stack_fffffffffffffff0);
        assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                            in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                            (char *)in_stack_ffffffffffffffb0,0,(char *)0x17c823,
                            in_stack_ffffffffffffffe0);
        archive_entry_atime(in_stack_fffffffffffffff0);
        paVar4 = (archive_entry_conflict *)0x0;
        assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                            in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                            (char *)in_stack_ffffffffffffffb0,0,(char *)0x17c85e,
                            in_stack_ffffffffffffffe0);
        archive_entry_stat(paVar4);
        assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                            in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                            (char *)in_stack_ffffffffffffffb0,0,(char *)0x17c89a,
                            in_stack_ffffffffffffffe0);
        archive_entry_uid(in_stack_fffffffffffffff0);
        assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                            in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                            (char *)in_stack_ffffffffffffffb0,0,(char *)0x17c8d5,
                            in_stack_ffffffffffffffe0);
        archive_entry_gid(in_stack_fffffffffffffff0);
        assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                            in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                            (char *)in_stack_ffffffffffffffb0,0,(char *)0x17c910,
                            in_stack_ffffffffffffffe0);
        archive_entry_is_encrypted(in_stack_fffffffffffffff0);
        assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                            in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                            (char *)in_stack_ffffffffffffffb0,0,(char *)0x17c949,
                            in_stack_ffffffffffffffe0);
        archive_read_has_encrypted_entries(in_stack_ffffffffffffffb8);
        paVar3 = a_00;
        assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                            in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                            (char *)in_stack_ffffffffffffffb0,(longlong)a_00,(char *)0x17c985,
                            in_stack_ffffffffffffffe0);
      }
      else {
        failure("Saw a file that shouldn\'t have been there");
        archive_entry_pathname(entry);
        paVar3 = (archive *)0x0;
        in_stack_ffffffffffffffb0 =
             (archive *)((ulong)in_stack_ffffffffffffffb0 & 0xffffffff00000000);
        assertion_equal_string
                  (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                   (char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                   (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   (char *)in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,
                   in_stack_fffffffffffffff0,(wchar_t)_v2);
      }
    }
  }
  archive_read_next_header(in_stack_ffffffffffffffb0,(archive_entry **)paVar3);
  iVar1 = 0;
  assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),in_stack_ffffffffffffffc4,
                      (longlong)in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,0,
                      (char *)0x17ca30,in_stack_ffffffffffffffe0);
  archive_filter_code(in_stack_ffffffffffffffb0,iVar1);
  assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),in_stack_ffffffffffffffc4,
                      (longlong)in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,0,
                      (char *)0x17ca6e,in_stack_ffffffffffffffe0);
  archive_format(a_00);
  assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),in_stack_ffffffffffffffc4,
                      (longlong)in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,0,
                      (char *)0x17caaa,in_stack_ffffffffffffffe0);
  archive_read_close((archive *)0x17cab4);
  assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),in_stack_ffffffffffffffc4,
                      (longlong)in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,
                      (longlong)a_00,(char *)0x17cae3,in_stack_ffffffffffffffe0);
  archive_read_free((archive *)0x17caed);
  assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),in_stack_ffffffffffffffc4,
                      (longlong)in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,0,
                      (char *)0x17cb1b,in_stack_ffffffffffffffe0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_iso_multi_extent)
{
	const char *refname = "test_read_format_iso_multi_extent.iso.Z";
	struct archive_entry *ae;
	struct archive *a;
	const void *p;
	size_t size;
	int64_t offset;
	int i;

	extract_reference_file(refname);
	assert((a = archive_read_new()) != NULL);
	assertEqualInt(0, archive_read_support_filter_all(a));
	assertEqualInt(0, archive_read_support_format_all(a));
	assertEqualInt(ARCHIVE_OK,
	    archive_read_open_filename(a, refname, 10240));

	/* Retrieve each of the 2 files on the ISO image and
	 * verify that each one is what we expect. */
	for (i = 0; i < 2; ++i) {
		assertEqualInt(0, archive_read_next_header(a, &ae));

		if (strcmp(".", archive_entry_pathname(ae)) == 0) {
			/* '.' root directory. */
			assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
			assertEqualInt(2048, archive_entry_size(ae));
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(0, archive_entry_mtime_nsec(ae));
			assertEqualInt(2, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualIntA(a, ARCHIVE_EOF,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 0);
		} else if (strcmp("file", archive_entry_pathname(ae)) == 0) {
			/* A regular file. */
			assertEqualString("file", archive_entry_pathname(ae));
			assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
			assertEqualInt(262280, archive_entry_size(ae));
			assertEqualInt(0,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt(0, offset);
			assertEqualMem(p, "head--head--head", 16);
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(1, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
			assertEqualInt(archive_entry_is_encrypted(ae), 0);
			assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);
		} else {
			failure("Saw a file that shouldn't have been there");
			assertEqualString(archive_entry_pathname(ae), "");
		}
	}

	/* End of archive. */
	assertEqualInt(ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify archive format. */
	assertEqualInt(archive_filter_code(a, 0), ARCHIVE_FILTER_COMPRESS);
	assertEqualInt(archive_format(a), ARCHIVE_FORMAT_ISO9660_ROCKRIDGE);

	/* Close the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}